

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_node.cpp
# Opt level: O0

void __thiscall
sequence_node_double_true_Test::~sequence_node_double_true_Test
          (sequence_node_double_true_Test *this)

{
  sequence_node_double_true_Test *this_local;
  
  ~sequence_node_double_true_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(sequence_node, double_true) {
  test_generator gen;
  auto root = gen.generate(
    "<bhvr_tree class = \"sequence_node\">"
      "<bhvr_tree class = \"true_node\"/>"
      "<bhvr_tree class = \"true_node\"/>"
    "</bhvr_tree>"
  );
  ASSERT_NE(nullptr, root);

  test_agent agent;
  EXPECT_EQ(0, agent.get_true_counter());
  EXPECT_EQ(0, agent.get_false_counter());

  test_agent_proxy ap(agent);
  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_TRUE(result);
    EXPECT_EQ(2, agent->get_true_counter());
    EXPECT_EQ(0, agent->get_false_counter());
  });
}